

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExpTokenizer
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  tokens tVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  anon_class_16_2_436b1a79 local_50;
  anon_class_24_3_e8f67b35 local_40;
  TempArenaAllocatorObject *local_28;
  TempArenaAllocatorObject *alloc;
  ThreadContext *threadContext;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_10;
  tokens tk;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  tVar1 = this->m_ptoken->tk;
  pSStack_10 = this;
  if (tVar1 == tkAsgDiv) {
    if (this->m_currentCharacter != this->m_pchMinTok + 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x333,"(m_currentCharacter == m_pchMinTok + 2)",
                         "m_currentCharacter == m_pchMinTok + 2");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else if (tVar1 == tkDiv) {
    if (this->m_currentCharacter != this->m_pchMinTok + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x330,"(m_currentCharacter == m_pchMinTok + 1)",
                         "m_currentCharacter == m_pchMinTok + 1");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x336,"(0)","Who is calling RescanRegExpNoParseTree?");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->m_currentCharacter = this->m_pchMinTok;
  if (*this->m_currentCharacter == '/') {
    this->m_currentCharacter = this->m_currentCharacter + 1;
    threadContext._4_4_ = tkNone;
    alloc = (TempArenaAllocatorObject *)ThreadContext::GetContextForCurrentThread();
    ThreadContext::EnsureRecycler((ThreadContext *)alloc);
    local_28 = ThreadContext::GetTemporaryAllocator((ThreadContext *)alloc,L"RescanRegExp");
    local_40.tk = (tokens *)((long)&threadContext + 4);
    local_40.alloc = &local_28;
    local_50.threadContext = (ThreadContext **)&alloc;
    local_50.alloc = &local_28;
    local_40.this = this;
    TryFinally<Scanner<UTF8EncodingPolicyBase<false>>::RescanRegExpTokenizer()::_lambda()_1_,Scanner<UTF8EncodingPolicyBase<false>>::RescanRegExpTokenizer()::_lambda(bool)_1_>
              (&local_40,&local_50);
    return threadContext._4_4_;
  }
  Error(this,-0x7ff5fc0c);
}

Assistant:

tokens Scanner<EncodingPolicy>::RescanRegExpTokenizer()
{
#if DEBUG
    switch (m_ptoken->tk)
    {
    case tkDiv:
        Assert(m_currentCharacter == m_pchMinTok + 1);
        break;
    case tkAsgDiv:
        Assert(m_currentCharacter == m_pchMinTok + 2);
        break;
    default:
        AssertMsg(FALSE, "Who is calling RescanRegExpNoParseTree?");
        break;
    }
#endif //DEBUG

    m_currentCharacter = m_pchMinTok;
    if (*m_currentCharacter != '/')
        Error(ERRnoSlash);
    m_currentCharacter++;

    tokens tk = tkNone;

    ThreadContext *threadContext = ThreadContext::GetContextForCurrentThread();
    threadContext->EnsureRecycler();
    Js::TempArenaAllocatorObject *alloc = threadContext->GetTemporaryAllocator(_u("RescanRegExp"));
    TryFinally(
        [&]() /* try block */
        {
            tk = this->ScanRegExpConstantNoAST(alloc->GetAllocator());
        },
        [&](bool /* hasException */) /* finally block */
        {
            threadContext->ReleaseTemporaryAllocator(alloc);
        });

    return tk;
}